

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::randomSolution(Graph *this)

{
  int iVar1;
  int iVar2;
  Vertex *pVVar3;
  Edge **ppEVar4;
  reference ppEVar5;
  Edge *pEVar6;
  Graph *pGVar7;
  int iVar8;
  int i;
  size_type __n;
  vector<Edge_*,_std::allocator<Edge_*>_> vec_edges;
  value_type local_50;
  _Vector_base<Edge_*,_std::allocator<Edge_*>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (Edge **)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (Edge **)0x0;
  pGVar7 = this;
  while (pVVar3 = pGVar7->verticesList, pVVar3 != (Vertex *)0x0) {
    ppEVar4 = &pVVar3->edgesList;
    while( true ) {
      local_50 = *ppEVar4;
      if (local_50 == (Edge *)0x0) break;
      local_50->closed = false;
      std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back
                ((vector<Edge_*,_std::allocator<Edge_*>_> *)&local_48,&local_50);
      ppEVar4 = &local_50->nextEdge;
    }
    local_50 = (value_type)0x0;
    pGVar7 = (Graph *)&pVVar3->nextVertex;
  }
  std::random_shuffle<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>>
            ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             local_48._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             local_48._M_impl.super__Vector_impl_data._M_finish);
  iVar1 = this->verticesSize;
  __n = 0;
  iVar8 = 0;
  while (iVar8 < iVar1 + -1) {
    ppEVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                        ((vector<Edge_*,_std::allocator<Edge_*>_> *)&local_48,__n);
    iVar2 = (*ppEVar5)->origin->idTree;
    ppEVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                        ((vector<Edge_*,_std::allocator<Edge_*>_> *)&local_48,__n);
    if (iVar2 != (*ppEVar5)->destiny->idTree) {
      ppEVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                          ((vector<Edge_*,_std::allocator<Edge_*>_> *)&local_48,__n);
      if ((*ppEVar5)->closed == false) {
        ppEVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)&local_48,__n);
        iVar2 = (*ppEVar5)->origin->idTree;
        pGVar7 = this;
        while (pVVar3 = pGVar7->verticesList, pVVar3 != (Vertex *)0x0) {
          if (pVVar3->idTree == iVar2) {
            ppEVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                                ((vector<Edge_*,_std::allocator<Edge_*>_> *)&local_48,__n);
            pVVar3->idTree = (*ppEVar5)->destiny->idTree;
          }
          pGVar7 = (Graph *)&pVVar3->nextVertex;
        }
        ppEVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)&local_48,__n);
        (*ppEVar5)->closed = true;
        ppEVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)&local_48,__n);
        iVar2 = (*ppEVar5)->destiny->id;
        ppEVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)&local_48,__n);
        pEVar6 = findEdge(this,iVar2,(*ppEVar5)->origin->id);
        pEVar6->closed = true;
        iVar8 = iVar8 + 1;
      }
    }
    __n = __n + 1;
  }
  printf("  Aberto:{");
  while (pVVar3 = this->verticesList, pVVar3 != (Vertex *)0x0) {
    ppEVar4 = &pVVar3->edgesList;
    while (pEVar6 = *ppEVar4, pEVar6 != (Edge *)0x0) {
      if (pEVar6->closed == false) {
        printf("%d,",(ulong)(uint)pEVar6->id);
      }
      ppEVar4 = &pEVar6->nextEdge;
    }
    this = (Graph *)&pVVar3->nextVertex;
  }
  printf("  }");
  std::_Vector_base<Edge_*,_std::allocator<Edge_*>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void Graph::randomSolution(){
    vector<Edge*> vec_edges;
    for(Vertex *v = this->get_verticesList(); v!=NULL; v = v->getNext()){
        for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){
            e->setSwitch(false);
            vec_edges.push_back(e);
        }
    }

    random_shuffle(vec_edges.begin(), vec_edges.end());

    int n_inserted_edges = 0, n_to_insert = this->verticesSize-1;
    for(int i=0; n_inserted_edges < n_to_insert; i++){

        if( (vec_edges.at(i)->getOrigin()->getIdTree() != vec_edges.at(i)->getDestiny()->getIdTree()) &&
                vec_edges.at(i)->isClosed()==false){

            int id = vec_edges.at(i)->getOrigin()->getIdTree();
            for(Vertex *no = this->verticesList; no!=NULL; no = no->getNext()){
                if(no->getIdTree()==id)
                    no->setIdTree(vec_edges.at(i)->getDestiny()->getIdTree());
            }
            vec_edges.at(i)->setSwitch(true);
            this->findEdge(vec_edges.at(i)->getDestiny()->getID(), vec_edges.at(i)->getOrigin()->getID())->setSwitch(true);

            n_inserted_edges++;
        }

    }

    printf("  Aberto:{");
    for(Vertex *v = this->verticesList; v!=NULL; v = v->getNext()){
        for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){
            if(e->isClosed()==false)
                printf("%d,", e->getID());
        }
    }
    printf("  }");
}